

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

void __thiscall MeCab::anon_unknown_0::TaggerImpl::TaggerImpl(TaggerImpl *this)

{
  Tagger *in_RDI;
  
  Tagger::Tagger(in_RDI);
  in_RDI->_vptr_Tagger = (_func_int **)&PTR_parse_001c5c50;
  in_RDI[1]._vptr_Tagger = (_func_int **)0x0;
  scoped_ptr<MeCab::(anonymous_namespace)::ModelImpl>::scoped_ptr
            ((scoped_ptr<MeCab::(anonymous_namespace)::ModelImpl> *)(in_RDI + 2),(ModelImpl *)0x0);
  scoped_ptr<MeCab::Lattice>::scoped_ptr((scoped_ptr<MeCab::Lattice> *)(in_RDI + 4),(Lattice *)0x0);
  *(undefined4 *)&in_RDI[6]._vptr_Tagger = 1;
  in_RDI[7]._vptr_Tagger = (_func_int **)0x3fe8000000000000;
  std::__cxx11::string::string((string *)(in_RDI + 8));
  return;
}

Assistant:

TaggerImpl::TaggerImpl()
    : current_model_(0),
      request_type_(MECAB_ONE_BEST), theta_(kDefaultTheta) {}